

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

void __thiscall QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault(QDialogButtonBoxPrivate *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  QWidget *this_00;
  QWidget *this_01;
  QWidget *pQVar5;
  long lVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QList<QPushButton_*> list;
  QArrayData *local_58;
  long lStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (this->buttonLists[0].d.size == 0) {
    this_00 = (QWidget *)0x0;
  }
  else {
    this_00 = (QWidget *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  }
  if (this_00 == (QWidget *)0x0) goto LAB_00477f35;
  pQVar7 = pQVar5;
  if (pQVar5 == (QWidget *)0x0) {
LAB_00477e2d:
    this_01 = (QWidget *)0x0;
  }
  else {
    do {
      if (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) goto LAB_00477e2d;
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
      this_01 = (QWidget *)QMetaObject::cast((QObject *)&QDialog::staticMetaObject);
    } while ((pQVar7 != (QWidget *)0x0) && (this_01 == (QWidget *)0x0));
  }
  pQVar7 = this_01;
  if (this_01 == (QWidget *)0x0) {
    pQVar7 = pQVar5;
  }
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  qt_qFindChildren_helper(pQVar7,0,0,&QPushButton::staticMetaObject,&local_58,1);
  lVar2 = lStack_50;
  if (local_48 == 0) {
LAB_00477ed1:
    QPushButton::setDefault((QPushButton *)this_00,true);
    if (((this_01 != (QWidget *)0x0) &&
        (bVar4 = QWidgetPrivate::hasChildWithFocusPolicy
                           (*(QWidgetPrivate **)&this_01->field_0x8,StrongFocus,pQVar5), !bVar4)) &&
       (pQVar5 = QWidget::focusWidget(this_01), pQVar5 == (QWidget *)0x0)) {
      QWidget::setFocus(this_00,OtherFocusReason);
    }
  }
  else {
    lVar1 = local_48 * 8;
    bVar4 = false;
    lVar6 = 0;
    do {
      pQVar7 = *(QWidget **)(lVar2 + lVar6);
      bVar3 = QPushButton::isDefault((QPushButton *)pQVar7);
      if (pQVar7 != this_00 && bVar3) {
        bVar4 = true;
        break;
      }
      bVar3 = lVar1 + -8 != lVar6;
      lVar6 = lVar6 + 8;
    } while (bVar3);
    if (!bVar4) goto LAB_00477ed1;
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
LAB_00477f35:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault()
{
    Q_Q(QDialogButtonBox);
    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QDialogButtonBox::AcceptRole];
    QPushButton *firstAcceptButton = acceptRoleList.isEmpty()
                                   ? nullptr
                                   : qobject_cast<QPushButton *>(acceptRoleList.at(0));

    if (!firstAcceptButton)
        return;

    bool hasDefault = false;
    QWidget *dialog = nullptr;
    QWidget *p = q;
    while (p && !p->isWindow()) {
        p = p->parentWidget();
        if ((dialog = qobject_cast<QDialog *>(p)))
            break;
    }

    QWidget *parent = dialog ? dialog : q;
    Q_ASSERT(parent);

    const auto pushButtons = parent->findChildren<QPushButton *>();
    for (QPushButton *pushButton : pushButtons) {
        if (pushButton->isDefault() && pushButton != firstAcceptButton) {
            hasDefault = true;
            break;
        }
    }
    if (!hasDefault && firstAcceptButton) {
        firstAcceptButton->setDefault(true);
        // When the QDialogButtonBox is focused, and it doesn't have an
        // explicit focus widget, it will transfer focus to its focus
        // proxy, which is the first button in the layout. This behavior,
        // combined with the behavior that QPushButtons in a QDialog will
        // by default have their autoDefault set to true, results in the
        // focus proxy/first button stealing the default button status
        // immediately when the button box is focused, which is not what
        // we want. Account for this by explicitly making the firstAcceptButton
        // focused as well, unless an explicit focus widget has been set, or
        // a dialog child has Qt::StrongFocus.
        if (dialog && !(QWidgetPrivate::get(dialog)->hasChildWithFocusPolicy(Qt::StrongFocus, q)
                        || dialog->focusWidget()))
            firstAcceptButton->setFocus();
    }
}